

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImU32 ImAlphaBlendColor(ImU32 col_a,ImU32 col_b)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint in_ESI;
  uint in_EDI;
  float t_00;
  int b;
  int g;
  int r;
  float t;
  
  t_00 = (float)(in_ESI >> 0x18) / 255.0;
  uVar1 = ImLerp<int>(in_EDI & 0xff,in_ESI & 0xff,t_00);
  iVar2 = ImLerp<int>(in_EDI >> 8 & 0xff,in_ESI >> 8 & 0xff,t_00);
  iVar3 = ImLerp<int>(in_EDI >> 0x10 & 0xff,in_ESI >> 0x10 & 0xff,t_00);
  return iVar3 << 0x10 | 0xff000000U | iVar2 << 8 | uVar1;
}

Assistant:

static inline ImU32 ImAlphaBlendColor(ImU32 col_a, ImU32 col_b)
{
    float t = ((col_b >> IM_COL32_A_SHIFT) & 0xFF) / 255.f;
    int r = ImLerp((int)(col_a >> IM_COL32_R_SHIFT) & 0xFF, (int)(col_b >> IM_COL32_R_SHIFT) & 0xFF, t);
    int g = ImLerp((int)(col_a >> IM_COL32_G_SHIFT) & 0xFF, (int)(col_b >> IM_COL32_G_SHIFT) & 0xFF, t);
    int b = ImLerp((int)(col_a >> IM_COL32_B_SHIFT) & 0xFF, (int)(col_b >> IM_COL32_B_SHIFT) & 0xFF, t);
    return IM_COL32(r, g, b, 0xFF);
}